

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

int gray_convert_glyph_inner(PWorker worker)

{
  PVG_FT_Vector *pPVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  PVG_FT_Vector *pPVar5;
  long lVar6;
  long lVar7;
  PVG_FT_Vector *pPVar8;
  long ex;
  long lVar9;
  byte *pbVar10;
  ulong uVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  int error;
  PVG_FT_Vector local_a8;
  PVG_FT_Vector local_98;
  PVG_FT_Vector local_88;
  TPos local_78;
  long local_70;
  TPos local_68;
  long local_60;
  PVG_FT_Vector local_58;
  PVG_FT_Vector local_48;
  long lVar11;
  
  iVar3 = _setjmp((__jmp_buf_tag *)worker->jump_buffer);
  if (iVar3 == 0) {
    uVar4 = 0;
    lVar7 = 0;
    while (lVar7 < (worker->outline).n_contours) {
      lVar9 = (long)(worker->outline).contours[lVar7];
      if (lVar9 < 0) {
LAB_00134060:
        error = -1;
        goto LAB_00134063;
      }
      pPVar1 = (worker->outline).points;
      pPVar8 = pPVar1 + lVar9;
      pPVar5 = pPVar1 + uVar4;
      local_a8.x = pPVar1[uVar4].x;
      local_a8.y = pPVar1[uVar4].y;
      lVar11 = pPVar1[lVar9].x;
      lVar6 = pPVar1[lVar9].y;
      local_98.x = pPVar1[uVar4].x;
      local_98.y = pPVar1[uVar4].y;
      pcVar2 = (worker->outline).tags;
      pbVar10 = (byte *)(pcVar2 + uVar4);
      if ((pcVar2[uVar4] & 3U) == 0) {
        if ((pcVar2[lVar9] & 3U) == 1) {
          pPVar8 = pPVar8 + -1;
        }
        else {
          uVar12 = (lVar11 + local_a8.x) - (lVar11 + local_a8.x >> 0x3f);
          uVar14 = (lVar6 + local_a8.y) - (lVar6 + local_a8.y >> 0x3f);
          auVar13._0_4_ = (undefined4)(uVar12 >> 1);
          auVar13._8_4_ = (undefined4)(uVar14 >> 1);
          auVar13._4_4_ = auVar13._8_4_;
          auVar13._12_4_ = (int)((long)uVar14 >> 0x21);
          lVar6 = auVar13._8_8_;
          lVar11 = CONCAT44((int)((long)uVar12 >> 0x21),auVar13._0_4_);
        }
        pPVar5 = pPVar5 + -1;
        pbVar10 = pbVar10 + -1;
        local_a8.x = lVar11;
        local_a8.y = lVar6;
      }
      else if ((pcVar2[uVar4] & 3U) == 2) goto LAB_00134060;
      local_70 = lVar9;
      local_60 = lVar7;
      if (worker->invalid == 0) {
        gray_record_cell(worker);
      }
      lVar7 = local_a8.x * 4;
      lVar9 = local_a8.y * 4;
      lVar11 = worker->min_ex;
      lVar6 = local_a8.x >> 6;
      if (worker->max_ex < local_a8.x >> 6) {
        lVar6 = worker->max_ex;
      }
      ex = lVar11 + -1;
      if (lVar11 <= lVar6) {
        ex = lVar6;
      }
      worker->area = 0;
      worker->cover = 0;
      worker->invalid = 0;
      worker->ex = ex - lVar11;
      worker->ey = (local_a8.y >> 6) - worker->min_ey;
      gray_set_cell(worker,ex,local_a8.y >> 6);
      worker->x = lVar7;
      worker->y = lVar9;
      local_78 = lVar9;
      local_68 = lVar7;
      while (pPVar5 < pPVar8) {
        if ((pbVar10[1] & 3) == 0) {
          local_98.x = pPVar5[1].x;
          local_98.y = pPVar5[1].y;
          pPVar5 = pPVar5 + 2;
          pbVar10 = pbVar10 + 2;
          while( true ) {
            if (pPVar8 <= pPVar5 + -1) {
              gray_render_conic(worker,&local_98,&local_a8);
              goto LAB_0013404c;
            }
            local_88.x = pPVar5->x;
            local_88.y = pPVar5->y;
            if ((*pbVar10 & 3) != 0) break;
            uVar12 = (local_88.x + local_98.x) - (local_88.x + local_98.x >> 0x3f);
            uVar14 = (local_88.y + local_98.y) - (local_88.y + local_98.y >> 0x3f);
            local_58.x = CONCAT44((int)((long)uVar12 >> 0x21),(int)(uVar12 >> 1));
            local_48.x = CONCAT44((int)((long)uVar14 >> 0x21),(int)(uVar14 >> 1));
            gray_render_conic(worker,&local_98,&local_58);
            local_98.x = local_88.x;
            local_98.y = local_88.y;
            pPVar5 = pPVar5 + 1;
            pbVar10 = pbVar10 + 1;
          }
          if ((*pbVar10 & 3) != 1) goto LAB_00134060;
          gray_render_conic(worker,&local_98,&local_88);
        }
        else if ((pbVar10[1] & 3) == 1) {
          pbVar10 = pbVar10 + 1;
          gray_render_line(worker,pPVar5[1].x << 2,pPVar5[1].y << 2);
          pPVar5 = pPVar5 + 1;
        }
        else {
          if ((pPVar8 < pPVar5 + 2) || ((pbVar10[2] & 3) != 2)) goto LAB_00134060;
          pPVar1 = pPVar5 + 3;
          local_88.x = pPVar5[1].x;
          local_88.y = pPVar5[1].y;
          local_58.x = pPVar5[2].x;
          local_58.y = pPVar5[2].y;
          if (pPVar8 < pPVar1) {
            gray_render_cubic(worker,&local_88,&local_58,&local_a8);
            goto LAB_0013404c;
          }
          pbVar10 = pbVar10 + 3;
          local_48.x = pPVar1->x;
          local_48.y = pPVar5[3].y;
          gray_render_cubic(worker,&local_88,&local_58,&local_48);
          pPVar5 = pPVar1;
        }
      }
      gray_render_line(worker,local_68,local_78);
LAB_0013404c:
      uVar4 = (int)local_70 + 1;
      lVar7 = local_60 + 1;
    }
    error = 0;
LAB_00134063:
    if (worker->invalid == 0) {
      gray_record_cell(worker);
    }
  }
  else {
    error = -4;
  }
  return error;
}

Assistant:

static int
  gray_convert_glyph_inner( RAS_ARG )
  {
    volatile int  error = 0;

    if ( pvg_ft_setjmp( ras.jump_buffer ) == 0 )
    {
      error = PVG_FT_Outline_Decompose( &ras.outline, &ras );
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );
    }
    else
    {
      error = ErrRaster_Memory_Overflow;
    }

    return error;
  }